

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall spv::Builder::createBranch(Builder *this,bool implicit,Block *block)

{
  Instruction *pIVar1;
  undefined7 in_register_00000031;
  _Head_base<0UL,_spv::Instruction_*,_false> *inst;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  _Head_base<0UL,_spv::Instruction_*,_false> local_30;
  
  inst = &local_38;
  pIVar1 = (Instruction *)::operator_new(0x60);
  pIVar1->_vptr_Instruction = (_func_int **)&PTR__Instruction_0089f058;
  pIVar1->resultId = 0;
  pIVar1->typeId = 0;
  pIVar1->opCode = OpBranch;
  (pIVar1->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar1->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (pIVar1->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar1->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar1->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pIVar1->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar1->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (pIVar1->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  pIVar1->block = (Block *)0x0;
  Instruction::addIdOperand
            (pIVar1,*(Id *)((long)(((block->instructions).
                                    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                  super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                  ._M_t + 8));
  if ((int)CONCAT71(in_register_00000031,implicit) == 0) {
    local_38._M_head_impl = pIVar1;
    addInstruction(this,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                        &local_38);
  }
  else {
    inst = &local_30;
    local_30._M_head_impl = pIVar1;
    addInstructionNoDebugInfo
              (this,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)inst);
  }
  pIVar1 = (((__uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true> *
             )&inst->_M_head_impl)->
           super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>)._M_t.
           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
           super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  if (pIVar1 != (Instruction *)0x0) {
    (*pIVar1->_vptr_Instruction[1])();
  }
  Block::addPredecessor(block,this->buildPoint);
  return;
}

Assistant:

void Builder::createBranch(bool implicit, Block* block)
{
    Instruction* branch = new Instruction(OpBranch);
    branch->addIdOperand(block->getId());
    if (implicit) {
        addInstructionNoDebugInfo(std::unique_ptr<Instruction>(branch));
    }
    else {
        addInstruction(std::unique_ptr<Instruction>(branch));
    }
    block->addPredecessor(buildPoint);
}